

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alu.cpp
# Opt level: O0

void __thiscall ALCdevice::ProcessUhj(ALCdevice *this,size_t SamplesToDo)

{
  uint uVar1;
  uint uVar2;
  reference pvVar3;
  size_type in_RDI;
  ALuint ridx;
  ALuint lidx;
  size_t in_stack_000000c0;
  FloatBufferLine *in_stack_000000c8;
  FloatBufferLine *in_stack_000000d0;
  FloatBufferLine *in_stack_000000d8;
  Uhj2Encoder *in_stack_000000e0;
  array<unsigned_int,_16UL> *in_stack_ffffffffffffffd0;
  
  pvVar3 = std::array<unsigned_int,_16UL>::operator[](in_stack_ffffffffffffffd0,in_RDI);
  uVar1 = *pvVar3;
  pvVar3 = std::array<unsigned_int,_16UL>::operator[](in_stack_ffffffffffffffd0,in_RDI);
  uVar2 = *pvVar3;
  std::unique_ptr<Uhj2Encoder,_std::default_delete<Uhj2Encoder>_>::operator->
            ((unique_ptr<Uhj2Encoder,_std::default_delete<Uhj2Encoder>_> *)0x1a5e50);
  al::span<std::array<float,_1024UL>,_18446744073709551615UL>::operator[]
            ((span<std::array<float,_1024UL>,_18446744073709551615UL> *)(in_RDI + 0x6e58),
             (ulong)uVar1);
  al::span<std::array<float,_1024UL>,_18446744073709551615UL>::operator[]
            ((span<std::array<float,_1024UL>,_18446744073709551615UL> *)(in_RDI + 0x6e58),
             (ulong)uVar2);
  al::span<std::array<float,_1024UL>,_18446744073709551615UL>::data
            ((span<std::array<float,_1024UL>,_18446744073709551615UL> *)(in_RDI + 0x6de8));
  Uhj2Encoder::encode(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,
                      in_stack_000000c0);
  return;
}

Assistant:

void ALCdevice::ProcessUhj(const size_t SamplesToDo)
{
    /* UHJ is stereo output only. */
    const ALuint lidx{RealOut.ChannelIndex[FrontLeft]};
    const ALuint ridx{RealOut.ChannelIndex[FrontRight]};

    /* Encode to stereo-compatible 2-channel UHJ output. */
    Uhj_Encoder->encode(RealOut.Buffer[lidx], RealOut.Buffer[ridx], Dry.Buffer.data(),
        SamplesToDo);
}